

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,1,_1,true>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,1,_1,false>>>
               (Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *lhs,
               Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>
               *rhs,Transpose<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                    *dest,Scalar *alpha)

{
  Index *this;
  long lVar1;
  ScalarWithConstIfNotLvalue *res;
  EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
  *this_00;
  float *ptr;
  size_t size;
  Index rows;
  TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *pTVar2;
  Index cols;
  ulong uVar3;
  Scalar *pSVar4;
  Index IVar5;
  Index resIncr;
  undefined1 *puVar6;
  Scalar SVar7;
  Scalar SVar8;
  float alpha_00;
  undefined1 auStack_238 [8];
  ScalarWithConstIfNotLvalue *local_230;
  EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
  *local_228;
  float *local_220;
  size_t local_218;
  Index local_210;
  TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *local_208;
  Index local_200;
  Scalar *local_1f8;
  float *local_1f0;
  Scalar *local_1e8;
  Scalar *local_1e0;
  float local_1d8;
  float local_1d4;
  BlockImpl_dense<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>,__1,_1,_true,_true>
  local_1d0;
  const_blas_data_mapper<float,_long,_0> local_168 [2];
  const_blas_data_mapper<float,_long,_1> local_148;
  undefined1 local_138 [8];
  aligned_stack_memory_handler<float> actualRhsPtr_stack_memory_destructor;
  RhsScalar *actualRhsPtr;
  undefined1 local_110 [3];
  gemv_static_vector_if<float,__1,__1,_false> static_rhs;
  ResScalar actualAlpha;
  type actualRhs;
  type actualLhs;
  Scalar *alpha_local;
  Transpose<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_> *dest_local;
  Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>
  *rhs_local;
  Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *lhs_local;
  
  puVar6 = auStack_238;
  actualRhs.m_matrix.
  super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
  .m_outerStride =
       (Index)blas_traits<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>::
              extract(lhs);
  blas_traits<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>_>_>
  ::extract((ExtractType *)local_110,rhs);
  local_1d8 = *alpha;
  SVar7 = blas_traits<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>::
          extractScalarFactor(lhs);
  local_1d4 = local_1d8 * SVar7;
  SVar8 = blas_traits<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>_>_>
          ::extractScalarFactor(rhs);
  alpha_00 = local_1d4 * SVar8;
  uVar3 = EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>_>_>
          ::size((EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
                  *)local_110);
  if (0x3fffffffffffffff < uVar3) {
    throw_std_bad_alloc();
  }
  pSVar4 = TransposeImpl<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>,_Eigen::Dense>
           ::data((TransposeImpl<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_Eigen::Dense>
                   *)local_110);
  if (pSVar4 == (Scalar *)0x0) {
    IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>_>_>
            ::size((EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
                    *)local_110);
    if ((ulong)(IVar5 * 4) < 0x20001) {
      IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
                      *)local_110);
      lVar1 = -(IVar5 * 4 + 0x1eU & 0xfffffffffffffff0);
      puVar6 = auStack_238 + lVar1;
      local_1e8 = (Scalar *)((long)&local_230 + lVar1);
    }
    else {
      IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
                      *)local_110);
      local_1e8 = (Scalar *)aligned_malloc(IVar5 << 2);
    }
    local_1e0 = local_1e8;
  }
  else {
    local_1e0 = TransposeImpl<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>,_Eigen::Dense>
                ::data((TransposeImpl<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_Eigen::Dense>
                        *)local_110);
    puVar6 = auStack_238;
  }
  actualRhsPtr_stack_memory_destructor._16_8_ = local_1e0;
  *(undefined8 *)(puVar6 + -8) = 0x2392ed;
  pSVar4 = TransposeImpl<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>,_Eigen::Dense>
           ::data((TransposeImpl<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_Eigen::Dense>
                   *)local_110);
  if (pSVar4 == (Scalar *)0x0) {
    local_1f0 = (float *)actualRhsPtr_stack_memory_destructor._16_8_;
  }
  else {
    local_1f0 = (float *)0x0;
  }
  local_220 = local_1f0;
  local_228 = (EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
               *)local_110;
  *(undefined8 *)(puVar6 + -8) = 0x23932f;
  local_218 = EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
                      *)local_110);
  this_00 = local_228;
  *(undefined8 *)(puVar6 + -8) = 0x239342;
  IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>_>_>
          ::size(this_00);
  size = local_218;
  ptr = local_220;
  *(undefined8 *)(puVar6 + -8) = 0x23936c;
  aligned_stack_memory_handler<float>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_138,ptr,size,0x20000 < (ulong)(IVar5 << 2)
            );
  this = &actualRhs.m_matrix.
          super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
          .m_outerStride;
  local_208 = (TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *)this;
  *(undefined8 *)(puVar6 + -8) = 0x23937f;
  local_210 = Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)this);
  pTVar2 = local_208;
  *(undefined8 *)(puVar6 + -8) = 0x239392;
  local_200 = Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)pTVar2);
  pTVar2 = local_208;
  *(undefined8 *)(puVar6 + -8) = 0x2393a5;
  local_1f8 = TransposeImpl<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Dense>::data
                        (pTVar2);
  *(undefined8 *)(puVar6 + -8) = 0x2393ba;
  local_148.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_stride =
       TransposeImpl<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Dense>::outerStride
                 ((TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *)
                  &actualRhs.m_matrix.
                   super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
                   .m_outerStride);
  local_148.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_data = local_1f8;
  local_168[0].super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data =
       (float *)actualRhsPtr_stack_memory_destructor._16_8_;
  local_168[0].super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = 1;
  *(undefined8 *)(puVar6 + -8) = 0x2394cc;
  local_230 = TransposeImpl<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_Eigen::Dense>
              ::data((TransposeImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Dense>
                      *)dest);
  *(undefined8 *)(puVar6 + -8) = 0x2394ec;
  DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
  ::col((ColXpr *)&local_1d0,
        (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
         *)dest,0);
  *(undefined8 *)(puVar6 + -8) = 0x2394fa;
  resIncr = BlockImpl_dense<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_-1,_1,_true,_true>
            ::innerStride(&local_1d0);
  cols = local_200;
  rows = local_210;
  res = local_230;
  *(undefined8 *)(puVar6 + -8) = 0x23952d;
  general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_1,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
  ::run(rows,cols,&local_148,local_168,res,resIncr,alpha_00);
  *(undefined8 *)(puVar6 + -8) = 0x23953b;
  aligned_stack_memory_handler<float>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_138);
  return;
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }